

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O3

Literal_t *
Rpo_Recursion(uint *target,Literal_t **vecLit,int nLit,int nLitCount,int nVars,int *thresholdCount,
             int thresholdMax,int verbose)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *vertexDegree;
  Rpo_LCI_Edge_t **edges;
  long lVar7;
  Rpo_LCI_Edge_t *pRVar8;
  Literal_t *pLVar9;
  uint *puVar10;
  uint *puVar11;
  Vec_Str_t *pVVar12;
  char *pcVar13;
  Literal_t *__ptr;
  Literal_t *pLVar14;
  Vec_Str_t *pVVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  long lVar21;
  Rpo_LCI_Edge_t RVar22;
  uint uVar23;
  char *pcVar24;
  int iVar25;
  int level;
  Literal_t **__size;
  Literal_t *pLVar26;
  Rpo_LCI_Edge_t **ppRVar27;
  size_t sVar28;
  undefined8 uVar29;
  ulong uVar30;
  uint *puVar31;
  Rpo_LCI_Edge_t RVar32;
  ulong uVar33;
  uint local_d4;
  char local_d0;
  ulong local_b8;
  int *local_80;
  
  iVar4 = *thresholdCount;
  *thresholdCount = iVar4 + 1;
  if (iVar4 + 1 != thresholdMax) {
    puVar10 = target;
    if (verbose == 0) {
      if (nLitCount != 1) goto LAB_005eb4c7;
    }
    else {
      Abc_Print((int)target,"Entering recursion %d\n");
      if (nLitCount != 1) {
LAB_005eb4c7:
        vertexDegree = (int *)malloc((long)nLit * 4);
        uVar16 = (ulong)(uint)nLit;
        if (0 < nLit) {
          memset(vertexDegree,0,uVar16 * 4);
        }
        __size = (Literal_t **)((long)(((nLit + -1) * nLit) / 2) << 3);
        edges = (Rpo_LCI_Edge_t **)malloc((size_t)__size);
        if (verbose != 0) {
          Abc_Print((int)__size,"Creating Edges: \n");
        }
        if (nLit < 1) {
          local_d4 = 0;
        }
        else {
          lVar17 = 2;
          lVar7 = 4;
          uVar30 = 0;
          local_d4 = 0;
          __size = vecLit;
          local_b8 = uVar16;
          local_80 = vertexDegree;
          do {
            if (vecLit[uVar30] != (Literal_t *)0x0) {
              lVar21 = (ulong)((uint)uVar30 & 0x3fffffff) * 0x10;
              RVar32 = (Rpo_LCI_Edge_t)(lVar17 + lVar21);
              RVar22 = (Rpo_LCI_Edge_t)(lVar21 + lVar7);
              uVar33 = 0;
              do {
                if (__size[uVar33] != (Literal_t *)0x0) {
                  iVar4 = Rpo_CheckANDGroup(vecLit[uVar30],__size[uVar33],nVars);
                  pLVar26 = vecLit[uVar30];
                  iVar5 = Rpo_CheckORGroup(pLVar26,__size[uVar33],nVars);
                  iVar25 = (int)pLVar26;
                  if (iVar4 != 0) {
                    if (verbose != 0) {
                      Abc_Print(iVar25,"Grouped: ");
                      Abc_Print(iVar25,"%s",__size[uVar33]->expression->pArray);
                      Abc_Print(iVar25," AND ");
                      Abc_Print(iVar25,"%s",vecLit[uVar30]->expression->pArray);
                      Abc_Print(iVar25,"\n");
                    }
                    iVar25 = 8;
                    pRVar8 = (Rpo_LCI_Edge_t *)malloc(8);
                    vertexDegree[uVar30] = vertexDegree[uVar30] + 1;
                    local_80[uVar33] = local_80[uVar33] + 1;
                    *pRVar8 = RVar32;
                    lVar21 = (long)(int)local_d4;
                    local_d4 = local_d4 + 1;
                    edges[lVar21] = pRVar8;
                  }
                  if (iVar5 != 0) {
                    if (verbose != 0) {
                      Abc_Print(iVar25,"Grouped: ");
                      Abc_Print(iVar25,"%s",__size[uVar33]->expression->pArray);
                      Abc_Print(iVar25," OR ");
                      Abc_Print(iVar25,"%s",vecLit[uVar30]->expression->pArray);
                      Abc_Print(iVar25,"\n");
                    }
                    pRVar8 = (Rpo_LCI_Edge_t *)malloc(8);
                    vertexDegree[uVar30] = vertexDegree[uVar30] + 1;
                    local_80[uVar33] = local_80[uVar33] + 1;
                    *pRVar8 = RVar22;
                    lVar21 = (long)(int)local_d4;
                    local_d4 = local_d4 + 1;
                    edges[lVar21] = pRVar8;
                  }
                }
                uVar33 = uVar33 + 1;
                RVar32 = (Rpo_LCI_Edge_t)((long)RVar32 + 0x400000000);
                RVar22 = (Rpo_LCI_Edge_t)((long)RVar22 + 0x400000000);
              } while (local_b8 != uVar33);
            }
            uVar30 = uVar30 + 1;
            __size = __size + 1;
            local_80 = local_80 + 1;
            lVar17 = lVar17 + 0x400000000;
            lVar7 = lVar7 + 0x400000000;
            local_b8 = local_b8 - 1;
          } while (uVar30 != uVar16);
        }
        if (verbose != 0) {
          Abc_Print((int)__size,"%d edges created.\n",(ulong)local_d4);
        }
        uVar2 = 1 << ((char)nVars - 5U & 0x1f);
        if (nVars < 6) {
          uVar2 = 1;
        }
        uVar16 = (ulong)uVar2 + 1;
        while (ppRVar27 = edges, uVar6 = Rpo_computeMinEdgeCost(edges,local_d4,vertexDegree),
              -1 < (int)uVar6) {
          RVar32 = *edges[uVar6];
          uVar23 = (uint)((ulong)RVar32 >> 4) & 0x3fffffff;
          uVar18 = RVar32._4_4_ >> 2;
          uVar30 = (ulong)RVar32 >> 0x22;
          if (uVar23 < uVar18) {
            uVar30 = (ulong)uVar23;
          }
          uVar33 = (ulong)uVar23;
          if (uVar23 <= uVar18) {
            uVar33 = (ulong)RVar32 >> 0x22;
          }
          *edges[uVar6] = (Rpo_LCI_Edge_t)((ulong)RVar32 | 1);
          pLVar26 = vecLit[uVar30];
          pLVar9 = vecLit[uVar33];
          puVar10 = (uint *)malloc((long)(int)uVar2 << 2);
          puVar31 = (uint *)malloc((long)(int)uVar2 << 2);
          iVar4 = pLVar26->expression->nSize;
          iVar5 = pLVar9->expression->nSize;
          level = 0x10;
          pVVar12 = (Vec_Str_t *)malloc(0x10);
          iVar25 = iVar5 + iVar4 + 3;
          if (iVar5 + iVar4 + 2U < 0xf) {
            iVar25 = 0x10;
          }
          pVVar12->nSize = 0;
          pVVar12->nCap = iVar25;
          if (iVar25 == 0) {
            pcVar24 = (char *)0x0;
          }
          else {
            sVar28 = (size_t)iVar25;
            pcVar24 = (char *)malloc(sVar28);
            level = (int)sVar28;
          }
          uVar6 = (uint)((ulong)RVar32 >> 1) & 3;
          pVVar12->pArray = pcVar24;
          if (uVar6 == 2) {
            if (0 < (int)uVar2) {
              puVar11 = pLVar26->function;
              puVar19 = pLVar9->function;
              uVar20 = uVar16;
              do {
                puVar10[uVar20 - 2] = puVar19[uVar20 - 2] | puVar11[uVar20 - 2];
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
              local_d0 = '+';
              goto LAB_005eba74;
            }
            local_d0 = '+';
          }
          else {
            if (uVar6 == 1) {
              if ((int)uVar2 < 1) {
                local_d0 = '*';
                goto LAB_005ebab7;
              }
              puVar11 = pLVar26->function;
              puVar19 = pLVar9->function;
              uVar20 = uVar16;
              do {
                puVar10[uVar20 - 2] = puVar19[uVar20 - 2] & puVar11[uVar20 - 2];
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
              local_d0 = '*';
            }
            else {
              Abc_Print(level,"Lit_GroupLiterals with op not defined.");
              local_d0 = '%';
            }
LAB_005eba74:
            if (0 < (int)uVar2) {
              puVar11 = pLVar26->transition;
              puVar19 = pLVar9->transition;
              uVar20 = uVar16;
              do {
                puVar31[uVar20 - 2] = puVar19[uVar20 - 2] | puVar11[uVar20 - 2];
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
            }
          }
LAB_005ebab7:
          if (iVar25 == 0) {
            if (pcVar24 == (char *)0x0) {
              pcVar24 = (char *)malloc(0x10);
            }
            else {
              pcVar24 = (char *)realloc(pcVar24,0x10);
            }
            pVVar12->pArray = pcVar24;
            pVVar12->nCap = 0x10;
          }
          pVVar12->nSize = 1;
          *pcVar24 = '(';
          pcVar24 = pLVar26->expression->pArray;
          sVar28 = strlen(pcVar24);
          if (0 < (int)(uint)sVar28) {
            uVar20 = 0;
            do {
              cVar1 = pcVar24[uVar20];
              uVar6 = pVVar12->nSize;
              if (uVar6 == pVVar12->nCap) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar12->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar12->pArray,0x10);
                  }
                  pVVar12->pArray = pcVar13;
                  pVVar12->nCap = 0x10;
                }
                else {
                  sVar3 = (ulong)uVar6 * 2;
                  if (pVVar12->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar3);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar12->pArray,sVar3);
                  }
                  pVVar12->pArray = pcVar13;
                  pVVar12->nCap = (int)sVar3;
                }
              }
              else {
                pcVar13 = pVVar12->pArray;
              }
              pVVar12->nSize = uVar6 + 1;
              pcVar13[(int)uVar6] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar28 & 0x7fffffff) != uVar20);
          }
          uVar6 = pVVar12->nSize;
          if (uVar6 == pVVar12->nCap) {
            if ((int)uVar6 < 0x10) {
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,0x10);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = 0x10;
            }
            else {
              sVar28 = (ulong)uVar6 * 2;
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar28);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,sVar28);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = (int)sVar28;
            }
          }
          else {
            pcVar24 = pVVar12->pArray;
          }
          pVVar12->nSize = uVar6 + 1;
          pcVar24[(int)uVar6] = local_d0;
          pcVar24 = pLVar9->expression->pArray;
          sVar28 = strlen(pcVar24);
          if (0 < (int)(uint)sVar28) {
            uVar20 = 0;
            do {
              cVar1 = pcVar24[uVar20];
              uVar6 = pVVar12->nSize;
              if (uVar6 == pVVar12->nCap) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar12->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar12->pArray,0x10);
                  }
                  pVVar12->pArray = pcVar13;
                  pVVar12->nCap = 0x10;
                }
                else {
                  sVar3 = (ulong)uVar6 * 2;
                  if (pVVar12->pArray == (char *)0x0) {
                    pcVar13 = (char *)malloc(sVar3);
                  }
                  else {
                    pcVar13 = (char *)realloc(pVVar12->pArray,sVar3);
                  }
                  pVVar12->pArray = pcVar13;
                  pVVar12->nCap = (int)sVar3;
                }
              }
              else {
                pcVar13 = pVVar12->pArray;
              }
              pVVar12->nSize = uVar6 + 1;
              pcVar13[(int)uVar6] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar28 & 0x7fffffff) != uVar20);
          }
          uVar6 = pVVar12->nSize;
          if (uVar6 == pVVar12->nCap) {
            if ((int)uVar6 < 0x10) {
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,0x10);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = 0x10;
            }
            else {
              sVar28 = (ulong)uVar6 * 2;
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar28);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,sVar28);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = (int)sVar28;
            }
          }
          else {
            pcVar24 = pVVar12->pArray;
          }
          pVVar12->nSize = uVar6 + 1;
          pcVar24[(int)uVar6] = ')';
          uVar6 = pVVar12->nSize;
          if (uVar6 == pVVar12->nCap) {
            if ((int)uVar6 < 0x10) {
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,0x10);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = 0x10;
            }
            else {
              sVar28 = (ulong)uVar6 * 2;
              if (pVVar12->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar28);
              }
              else {
                pcVar24 = (char *)realloc(pVVar12->pArray,sVar28);
              }
              pVVar12->pArray = pcVar24;
              pVVar12->nCap = (int)sVar28;
            }
          }
          else {
            pcVar24 = pVVar12->pArray;
          }
          pVVar12->nSize = uVar6 + 1;
          pcVar24[(int)uVar6] = '\0';
          uVar29 = 0x18;
          __ptr = (Literal_t *)malloc(0x18);
          __ptr->function = puVar10;
          __ptr->transition = puVar31;
          __ptr->expression = pVVar12;
          vecLit[uVar30] = __ptr;
          vecLit[uVar33] = (Literal_t *)0x0;
          if (verbose == 0) {
            iVar4 = 0;
          }
          else {
            Abc_Print((int)uVar29,"New Literal Cluster found: ");
            Abc_Print((int)uVar29,"%s",__ptr->expression->pArray);
            Abc_Print((int)uVar29," -> ");
            iVar4 = (int)uVar29;
            if (0 < nVars) {
              puVar10 = __ptr->function;
              uVar20 = (ulong)(uint)nVars + 1;
              do {
                Abc_Print((int)uVar29,"%08X",(ulong)puVar10[uVar20 - 2]);
                iVar4 = (int)uVar29;
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
            }
            Abc_Print(iVar4,"\n");
            iVar4 = verbose;
          }
          pLVar14 = Rpo_Recursion(target,vecLit,nLit,nLitCount + -1,nVars,thresholdCount,
                                  thresholdMax,iVar4);
          if (__ptr->function != (uint *)0x0) {
            free(__ptr->function);
            __ptr->function = (uint *)0x0;
          }
          if (__ptr->transition != (uint *)0x0) {
            free(__ptr->transition);
            __ptr->transition = (uint *)0x0;
          }
          pVVar12 = __ptr->expression;
          pcVar24 = pVVar12->pArray;
          if (pcVar24 != (char *)0x0) {
            free(pcVar24);
          }
          free(pVVar12);
          free(__ptr);
          vecLit[uVar30] = pLVar26;
          vecLit[uVar33] = pLVar9;
          if ((*thresholdCount == thresholdMax) || (pLVar14 != (Literal_t *)0x0)) goto LAB_005ec038;
        }
        if (verbose == 0) {
          pLVar14 = (Literal_t *)0x0;
        }
        else {
          pLVar14 = (Literal_t *)0x0;
          Abc_Print((int)ppRVar27,"There is no edges unvisited... Exiting recursion.\n");
        }
LAB_005ec038:
        if (vertexDegree != (int *)0x0) {
          free(vertexDegree);
        }
        if ((int)local_d4 < 1) {
          if (edges == (Rpo_LCI_Edge_t **)0x0) {
            return pLVar14;
          }
        }
        else {
          uVar16 = 0;
          do {
            if (edges[uVar16] != (Rpo_LCI_Edge_t *)0x0) {
              free(edges[uVar16]);
              edges[uVar16] = (Rpo_LCI_Edge_t *)0x0;
            }
            uVar16 = uVar16 + 1;
          } while (local_d4 != uVar16);
        }
        free(edges);
        return pLVar14;
      }
      Abc_Print((int)puVar10,"Checking solution: ");
    }
    iVar4 = (int)puVar10;
    if (0 < nLit) {
      uVar2 = 1 << ((char)nVars - 5U & 0x1f);
      if (nVars < 6) {
        uVar2 = 1;
      }
      puVar31 = (uint *)(ulong)uVar2;
      uVar16 = 0;
      do {
        pLVar26 = vecLit[uVar16];
        if (pLVar26 != (Literal_t *)0x0) {
          puVar11 = pLVar26->function;
          puVar19 = puVar31;
          do {
            if ((int)puVar19 < 1) {
              pLVar9 = (Literal_t *)malloc(0x18);
              sVar28 = (long)(int)uVar2 * 4;
              puVar10 = (uint *)malloc(sVar28);
              pLVar9->function = puVar10;
              if ((int)uVar2 < 1) {
                puVar10 = (uint *)malloc(sVar28);
                pLVar9->transition = puVar10;
              }
              else {
                uVar16 = (long)puVar31 + 1;
                do {
                  puVar10[uVar16 - 2] = puVar11[uVar16 - 2];
                  uVar16 = uVar16 - 1;
                } while (1 < uVar16);
                puVar11 = (uint *)malloc(sVar28);
                pLVar9->transition = puVar11;
                puVar10 = pLVar26->transition;
                uVar16 = (long)puVar31 + 1;
                do {
                  puVar11[uVar16 - 2] = puVar10[uVar16 - 2];
                  uVar16 = uVar16 - 1;
                } while (1 < uVar16);
              }
              pVVar12 = pLVar26->expression;
              pVVar15 = (Vec_Str_t *)malloc(0x10);
              iVar4 = pVVar12->nSize;
              pVVar15->nSize = iVar4;
              iVar5 = pVVar12->nCap;
              pVVar15->nCap = iVar5;
              if ((long)iVar5 == 0) {
                pcVar24 = (char *)0x0;
              }
              else {
                pcVar24 = (char *)malloc((long)iVar5);
              }
              pVVar15->pArray = pcVar24;
              memcpy(pcVar24,pVVar12->pArray,(long)iVar4);
              iVar4 = (int)pcVar24;
              pLVar9->expression = pVVar15;
              if (verbose == 0) {
                return pLVar9;
              }
              pcVar24 = "FOUND!\n";
              goto LAB_005ec02c;
            }
            lVar7 = (long)puVar19 + -1;
            puVar10 = (uint *)((long)puVar19 + -1);
            lVar17 = (long)puVar19 + -1;
            puVar19 = puVar10;
          } while (target[lVar7] == puVar11[lVar17]);
        }
        iVar4 = (int)puVar10;
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uint)nLit);
    }
    if (verbose != 0) {
      pcVar24 = "FAILED!\n";
      pLVar9 = (Literal_t *)0x0;
LAB_005ec02c:
      Abc_Print(iVar4,pcVar24,thresholdCount);
      return pLVar9;
    }
  }
  return (Literal_t *)0x0;
}

Assistant:

Literal_t* Rpo_Recursion(unsigned* target, Literal_t** vecLit, int nLit, int nLitCount, int nVars, int* thresholdCount, int thresholdMax, int verbose) {
    int i, j, k;
    Literal_t* copyResult;
    int* vertexDegree;
    int v;
    int edgeSize;
    Rpo_LCI_Edge_t** edges;
    int edgeCount = 0;
    int isAnd;
    int isOr;
    Rpo_LCI_Edge_t* edge;
    Literal_t* result = NULL;
    int edgeIndex;
    int minLitIndex;
    int maxLitIndex;
    Literal_t* oldLit1;
    Literal_t* oldLit2;
    Literal_t* newLit;

    *thresholdCount = *thresholdCount + 1;
    if (*thresholdCount == thresholdMax) {
        return NULL;
    }
    if (verbose) {
        Abc_Print(-2, "Entering recursion %d\n", *thresholdCount);
    }
    // verify if solution is the target or not
    if (nLitCount == 1) {
        if (verbose) {
            Abc_Print(-2, "Checking solution: ");
        }
        for (k = 0; k < nLit; ++k) {
            if (vecLit[k] != NULL) {
                if (Kit_TruthIsEqual(target, vecLit[k]->function, nVars)) {
                    copyResult = Lit_Copy(vecLit[k], nVars);
                    if (verbose) {
                        Abc_Print(-2, "FOUND!\n", thresholdCount);
                    }
                    thresholdCount = 0; //??
                    return copyResult;
                }
            }
        }
        if (verbose) {
            Abc_Print(-2, "FAILED!\n", thresholdCount);
        }
        return NULL;
    }

    vertexDegree = ABC_ALLOC(int, nLit);
    //    if(verbose) {
    //        Abc_Print(-2,"Allocating vertexDegree...\n");
    //    }
    for (v = 0; v < nLit; v++) {
        vertexDegree[v] = 0;
    }
    // building edges
    edgeSize = (nLit * (nLit - 1)) / 2;
    edges = ABC_ALLOC(Rpo_LCI_Edge_t*, edgeSize);
    if (verbose) {
        Abc_Print(-2, "Creating Edges: \n");
    }

    for (i = 0; i < nLit; ++i) {
        if (vecLit[i] == NULL) {
            continue;
        }
        for (j = i; j < nLit; ++j) {
            if (vecLit[j] == NULL) {
                continue;
            }
            isAnd = Rpo_CheckANDGroup(vecLit[i], vecLit[j], nVars);
            isOr = Rpo_CheckORGroup(vecLit[i], vecLit[j], nVars);
            if (isAnd) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " AND ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_AND, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
            if (isOr) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " OR ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_OR, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
        }
    }
    if (verbose) {
        Abc_Print(-2, "%d edges created.\n", edgeCount);
    }


    //traverse the edges, grouping new Literal Clusters
    do {
        edgeIndex = Rpo_computeMinEdgeCost(edges, edgeCount, vertexDegree);
        if (edgeIndex < 0) {
            if (verbose) {
                Abc_Print(-2, "There is no edges unvisited... Exiting recursion.\n");
                //exit(-1);
            }
            break;
            //return NULL; // the graph does not have unvisited edges
        }
        edge = edges[edgeIndex];
        edge->visited = 1;
        //Rpo_PrintEdge(edge);
        minLitIndex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
        maxLitIndex = (edge->idx1 > edge->idx2) ? edge->idx1 : edge->idx2;
        oldLit1 = vecLit[minLitIndex];
        oldLit2 = vecLit[maxLitIndex];
        newLit = Lit_GroupLiterals(oldLit1, oldLit2, (Operator_t)edge->connectionType, nVars);
        vecLit[minLitIndex] = newLit;
        vecLit[maxLitIndex] = NULL;

        if (verbose) {
            Abc_Print(-2, "New Literal Cluster found: ");
            Lit_PrintExp(newLit);
            Abc_Print(-2, " -> ");
            Lit_PrintTT(newLit->function, nVars);
            Abc_Print(-2, "\n");
        }
        result = Rpo_Recursion(target, vecLit, nLit, (nLitCount - 1), nVars, thresholdCount, thresholdMax, verbose);
        //independent of result, free the newLit and restore the vector of Literal Clusters
        Lit_Free(newLit);
        vecLit[minLitIndex] = oldLit1;
        vecLit[maxLitIndex] = oldLit2;
        if (*thresholdCount == thresholdMax) {
            break;
        }
    } while (result == NULL);
    //freeing memory
    //    if(verbose) {
    //        Abc_Print(-2,"Freeing vertexDegree...\n");
    //    }
    ABC_FREE(vertexDegree);
    for (i = 0; i < edgeCount; ++i) {
        //Abc_Print(-2, "%p ", edges[i]);
        ABC_FREE(edges[i]);
    }
    ABC_FREE(edges);
    return result;
}